

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *in_RSI;
  char *in_stack_00000018;
  char *value;
  string env_var;
  char *local_60;
  string local_30 [32];
  char *local_10;
  
  local_10 = in_RSI;
  FlagToEnvVar_abi_cxx11_(in_stack_00000018);
  std::__cxx11::string::c_str();
  local_60 = posix::GetEnv((char *)0x1506c4);
  if (local_60 == (char *)0x0) {
    local_60 = local_10;
  }
  std::__cxx11::string::~string(local_30);
  return local_60;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == nullptr ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}